

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

void __thiscall QAuthenticatorPrivate::QAuthenticatorPrivate(QAuthenticatorPrivate *this)

{
  quint64 qVar1;
  long in_RDI;
  QByteArray *this_00;
  char *__command;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar2;
  QByteArray *in_stack_ffffffffffffff78;
  QByteArrayView *in_stack_ffffffffffffff80;
  undefined1 local_60 [24];
  Algorithm local_48;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x205550);
  QString::QString((QString *)0x20555e);
  QString::QString((QString *)0x20556c);
  QHash<QString,_QVariant>::QHash((QHash<QString,_QVariant> *)(in_RDI + 0x48));
  *(undefined4 *)(in_RDI + 0x50) = 0;
  QString::QString((QString *)0x20558f);
  QByteArray::QByteArray((QByteArray *)0x20559d);
  uVar2 = 0;
  QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_>::QScopedPointer
            ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
             (in_RDI + 0x88),(QGssApiHandles *)0x0);
  *(undefined1 *)(in_RDI + 0x90) = 0;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  this_00 = (QByteArray *)(in_RDI + 0x98);
  QByteArray::QByteArray((QByteArray *)0x2055dd);
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  QString::QString((QString *)0x2055f8);
  __command = (char *)(in_RDI + 0xd0);
  QString::QString((QString *)0x205609);
  QRandomGenerator::system(__command);
  qVar1 = QRandomGenerator::generate64((QRandomGenerator *)0x205616);
  QByteArray::number((ulonglong)local_60,(int)qVar1);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QCryptographicHash::hash((QByteArrayView *)local_38,local_48);
  QByteArray::toHex((char)local_20);
  QByteArray::operator=(this_00,(QByteArray *)CONCAT44(uVar2,in_stack_ffffffffffffff68));
  QByteArray::~QByteArray((QByteArray *)0x20568b);
  QByteArray::~QByteArray((QByteArray *)0x205695);
  QByteArray::~QByteArray((QByteArray *)0x20569f);
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAuthenticatorPrivate::QAuthenticatorPrivate()
    : method(None)
    , hasFailed(false)
    , phase(Start)
    , nonceCount(0)
{
    cnonce = QCryptographicHash::hash(QByteArray::number(QRandomGenerator::system()->generate64(), 16),
                                      QCryptographicHash::Md5).toHex();
    nonceCount = 0;
}